

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O0

Error __thiscall
asmjit::CodeCompiler::_newReg(CodeCompiler *this,Reg *out,uint32_t typeId,char *name)

{
  Error EVar1;
  VirtReg *pVVar2;
  CodeEmitter *in_RCX;
  uint32_t in_EDX;
  undefined8 *in_RSI;
  VirtReg *vReg;
  Error err;
  RegInfo regInfo;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  Error in_stack_fffffffffffffee4;
  Error local_f8;
  char *in_stack_ffffffffffffff18;
  CodeCompiler *in_stack_ffffffffffffff28;
  
  EVar1 = ArchUtils::typeIdToRegInfo
                    (in_EDX,(uint32_t *)in_RCX,
                     (RegInfo *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if (EVar1 == 0) {
    pVVar2 = newVirtReg(in_stack_ffffffffffffff28,
                        (uint32_t)((ulong)&stack0xfffffffffffffee4 >> 0x20),
                        (uint32_t)&stack0xfffffffffffffee4,in_stack_ffffffffffffff18);
    if (pVVar2 == (VirtReg *)0x0) {
      *in_RSI = 0;
      in_RSI[1] = 0;
      local_f8 = CodeEmitter::setLastError(in_RCX,in_stack_fffffffffffffee4,(char *)0x0);
    }
    else {
      *in_RSI = CONCAT44(pVVar2->_id,in_stack_fffffffffffffee4);
      in_RSI[1] = 0;
      local_f8 = 0;
    }
  }
  else {
    local_f8 = CodeEmitter::setLastError(in_RCX,in_stack_fffffffffffffee4,in_stack_fffffffffffffed8)
    ;
  }
  return local_f8;
}

Assistant:

Error CodeCompiler::_newReg(Reg& out, uint32_t typeId, const char* name) {
  RegInfo regInfo;

  Error err = ArchUtils::typeIdToRegInfo(getArchType(), typeId, regInfo);
  if (ASMJIT_UNLIKELY(err)) return setLastError(err);

  VirtReg* vReg = newVirtReg(typeId, regInfo.getSignature(), name);
  if (ASMJIT_UNLIKELY(!vReg)) {
    out.reset();
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));
  }

  out._initReg(regInfo.getSignature(), vReg->getId());
  return kErrorOk;
}